

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::insert_branch_(DaTrie<false,_false,_false> *this,Query *query)

{
  bool bVar1;
  uint8_t label;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  Edge *edge_00;
  Edge *pEVar6;
  reference pvVar7;
  char *pcVar8;
  reference pvVar9;
  byte *pbVar10;
  Query *in_RSI;
  ulong __n;
  Query *in_RDI;
  uint32_t value;
  uint32_t child_pos;
  uint32_t base;
  Edge edge;
  uint8_t branch;
  uint32_t tail_pos;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Edge local_120;
  byte local_15;
  uint32_t local_14;
  Query *local_10;
  
  local_10 = in_RSI;
  uVar2 = Query::node_pos(in_RSI);
  edge_00 = (Edge *)(ulong)uVar2;
  pEVar6 = (Edge *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size
                             ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI);
  if (pEVar6 <= edge_00) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1c5,
                  "void ddd::DaTrie<false, false, false>::insert_branch_(Query &) [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  uVar2 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
  bVar1 = Bc::is_leaf(pvVar7);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_leaf()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1c6,
                  "void ddd::DaTrie<false, false, false>::insert_branch_(Query &) [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  uVar2 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
  local_14 = Bc::value(pvVar7);
  while( true ) {
    pcVar8 = Query::key(local_10);
    iVar3 = (int)*pcVar8;
    pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),(ulong)local_14);
    if (iVar3 != *pvVar9) break;
    append_edge_((DaTrie<false,_false,_false> *)edge_00,in_RDI);
    local_14 = local_14 + 1;
    in_RDI[4].pos_ = in_RDI[4].pos_ + 1;
  }
  __n = (ulong)local_14;
  local_14 = local_14 + 1;
  pbVar10 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),__n);
  local_15 = *pbVar10;
  in_RDI[4].pos_ = in_RDI[4].pos_ + 1;
  Edge::Edge(&local_120);
  Edge::push(&local_120,local_15);
  label = Query::label(local_10);
  Edge::push(&local_120,label);
  uVar2 = xcheck_((DaTrie<false,_false,_false> *)
                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),edge_00,
                  (vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_RDI);
  uVar4 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar4);
  Bc::set_base(pvVar7,uVar2);
  uVar5 = uVar2 ^ local_15;
  fix_((DaTrie<false,_false,_false> *)edge_00,(uint32_t)((ulong)in_RDI >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)CONCAT44(iVar3,in_stack_fffffffffffffeb0))
  ;
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar5);
  uVar2 = Query::node_pos(local_10);
  Bc::set_check(pvVar7,uVar2);
  if (local_15 == 0) {
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x15b0d8);
    uVar2 = *(uint32_t *)(pcVar8 + local_14);
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar5);
    Bc::set_value(pvVar7,uVar2);
    in_RDI[4].pos_ = in_RDI[4].pos_ + 4;
  }
  else {
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar5);
    Bc::set_value(pvVar7,local_14);
  }
  insert_edge_((DaTrie<false,_false,_false> *)edge_00,in_RDI);
  Edge::~Edge(&local_120);
  return;
}

Assistant:

void insert_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());

    auto tail_pos = bc_[query.node_pos()].value();

    while (*query.key() == tail_[tail_pos]) {
      append_edge_(query);
      ++tail_pos;
      ++tail_emps_;
    }

    auto branch = static_cast<uint8_t>(tail_[tail_pos++]);
    ++tail_emps_;

    Edge edge;
    edge.push(branch);
    edge.push(query.label());

    auto base = xcheck_(edge, blocks_);
    bc_[query.node_pos()].set_base(base);

    auto child_pos = base ^branch;
    fix_(child_pos, blocks_);

    bc_[child_pos].set_check(query.node_pos());
    if (branch != '\0') {
      bc_[child_pos].set_value(tail_pos);
    } else {
      uint32_t value = 0;
      std::memcpy(&value, tail_.data() + tail_pos, sizeof(uint32_t));
      bc_[child_pos].set_value(value);
      tail_emps_ += sizeof(uint32_t);
    }

    if (WithNLM) {
      node_links_[query.node_pos()].child = branch;
      node_links_[child_pos].sib = branch;
    }
    insert_edge_(query);
  }